

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QUrlModel::WatchItem>::emplace<QUrlModel::WatchItem>
          (QMovableArrayOps<QUrlModel::WatchItem> *this,qsizetype i,WatchItem *args)

{
  WatchItem **ppWVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  WatchItem tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
           super_QArrayDataPointer<QUrlModel::WatchItem>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QUrlModel::WatchItem>).
        super_QArrayDataPointer<QUrlModel::WatchItem>.size == i) {
      qVar5 = QArrayDataPointer<QUrlModel::WatchItem>::freeSpaceAtEnd
                        ((QArrayDataPointer<QUrlModel::WatchItem> *)this);
      if (qVar5 == 0) goto LAB_004af56f;
      QUrlModel::WatchItem::WatchItem
                ((this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                 super_QArrayDataPointer<QUrlModel::WatchItem>.ptr +
                 (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                 super_QArrayDataPointer<QUrlModel::WatchItem>.size,args);
LAB_004af65e:
      pqVar2 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                super_QArrayDataPointer<QUrlModel::WatchItem>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_004af61d;
    }
LAB_004af56f:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QUrlModel::WatchItem>::freeSpaceAtBegin
                        ((QArrayDataPointer<QUrlModel::WatchItem> *)this);
      if (qVar5 != 0) {
        QUrlModel::WatchItem::WatchItem
                  ((this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                   super_QArrayDataPointer<QUrlModel::WatchItem>.ptr + -1,args);
        ppWVar1 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
                   super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
        *ppWVar1 = *ppWVar1 + -1;
        goto LAB_004af65e;
      }
    }
  }
  tmp.path.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.index.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.index._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.index.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QUrlModel::WatchItem::WatchItem(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QUrlModel::WatchItem>).
          super_QArrayDataPointer<QUrlModel::WatchItem>.size != 0;
  QArrayDataPointer<QUrlModel::WatchItem>::detachAndGrow
            ((QArrayDataPointer<QUrlModel::WatchItem> *)this,(uint)(i == 0 && bVar6),1,
             (WatchItem **)0x0,(QArrayDataPointer<QUrlModel::WatchItem> *)0x0);
  if (i == 0 && bVar6) {
    QUrlModel::WatchItem::WatchItem
              ((this->super_QGenericArrayOps<QUrlModel::WatchItem>).
               super_QArrayDataPointer<QUrlModel::WatchItem>.ptr + -1,&tmp);
    ppWVar1 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
               super_QArrayDataPointer<QUrlModel::WatchItem>.ptr;
    *ppWVar1 = *ppWVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QUrlModel::WatchItem>).
              super_QArrayDataPointer<QUrlModel::WatchItem>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QUrlModel::WatchItem> *)this,i,1);
    QUrlModel::WatchItem::WatchItem(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&tmp.path.d);
LAB_004af61d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }